

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_context.c
# Opt level: O0

char * rfc5444_strerror(rfc5444_result result)

{
  char *UNKNOWN;
  char *pcStack_10;
  rfc5444_result result_local;
  
  if ((result < RFC5444_OKAY) || (RFC5444_DROP_PACKET < result)) {
    if ((result < RFC5444_OKAY) && (0xffffffeb < result)) {
      pcStack_10 = _rfc5444_negative_result_texts[-result];
    }
    else {
      pcStack_10 = "Unknown RFC5444-API result";
    }
  }
  else {
    pcStack_10 = _rfc5444_positive_result_texts[result];
  }
  return pcStack_10;
}

Assistant:

const char *
rfc5444_strerror(enum rfc5444_result result) {
  const char *UNKNOWN = "Unknown RFC5444-API result";
  if (result >= RFC5444_OKAY && result <= RFC5444_RESULT_MAX) {
    return _rfc5444_positive_result_texts[result];
  }
  if (result < RFC5444_OKAY && result >= RFC5444_RESULT_MIN) {
    return _rfc5444_negative_result_texts[-result];
  }
  return UNKNOWN;
}